

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

void fsnav_linal_msq1T_u(double *res,double *v,size_t m,size_t n)

{
  long lVar1;
  size_t sVar2;
  double *pdVar3;
  size_t sVar4;
  ulong uVar5;
  double dVar6;
  
  lVar1 = 0;
  for (sVar2 = 0; pdVar3 = v, sVar4 = sVar2, sVar2 != n; sVar2 = sVar2 + 1) {
    for (; sVar4 != n; sVar4 = sVar4 + 1) {
      res[lVar1] = 0.0;
      dVar6 = 0.0;
      for (uVar5 = 0; uVar5 < m * n; uVar5 = uVar5 + n) {
        dVar6 = dVar6 + v[uVar5] * pdVar3[uVar5];
        res[lVar1] = dVar6;
      }
      lVar1 = lVar1 + 1;
      pdVar3 = pdVar3 + 1;
    }
    v = v + 1;
  }
  return;
}

Assistant:

void fsnav_linal_msq1T_u(double* res, double* v, const size_t m, const size_t n)
{
	size_t j, j1, i, k, mn;

	mn = m*n;
	for (j = 0, j1 = 0, k = 0; j < n; j++)
		for (j1 = j; j1 < n; j1++, k++)
			for (i = 0, res[k] = 0; i < mn; i += n)
				res[k] += v[i+j]*v[i+j1];
}